

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

bool __thiscall
GlobOpt::HasLiveObjectHeaderInlinedTypeSym
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  Type TVar1;
  EquivalentTypeSet *this_00;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  bool bVar6;
  TypeId TVar7;
  undefined4 *puVar8;
  Value *pVVar9;
  JsTypeValueInfo *pJVar10;
  JITType *pJVar11;
  JITTypeHandler *pJVar12;
  undefined7 in_register_00000011;
  uint16 index;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  SymID typeSymId;
  nullptr_t local_48;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder type;
  
  pBVar13 = this->objectTypeSyms;
  bVar4 = false;
  if (pBVar13 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    puVar8 = (undefined4 *)
             __tls_get_addr(&PTR_0155fe48,&block->globOptData,
                            CONCAT71(in_register_00000011,isObjTypeSpecialized));
    do {
      pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)pBVar13->head;
      if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        cVar16 = '\x02';
        break;
      }
      uVar15 = ((Type *)&pBVar13->alloc)->word;
      if (uVar15 == 0) {
        cVar16 = '\0';
      }
      else {
        TVar1 = *(Type *)&pBVar13->lastFoundIndex;
        uVar14 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        do {
          typeSymId = TVar1 + (BVIndex)uVar14;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar14);
          if (typeSymId != opndId) {
            pVVar9 = GlobOptBlockData::FindObjectTypeValue(&block->globOptData,typeSymId);
            if (pVVar9 == (Value *)0x0) {
LAB_004a30d4:
              cVar16 = '\0';
            }
            else {
              type.t._4_4_ = typeSymId;
              pJVar10 = ValueInfo::AsJsType(pVVar9->valueInfo);
              if (pJVar10 == (JsTypeValueInfo *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                   ,0x3f7,"(valueInfo)","valueInfo");
                if (!bVar4) {
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                *puVar8 = 0;
              }
              local_40.t = (pJVar10->jsType).t;
              local_48 = (nullptr_t)0x0;
              bVar4 = JITTypeHolderBase<void>::operator!=(&local_40,&local_48);
              if (bVar4) {
                local_40.t = (pJVar10->jsType).t;
                pJVar11 = JITTypeHolderBase<void>::operator->(&local_40);
                TVar7 = JITType::GetTypeId(pJVar11);
                bVar4 = Js::DynamicType::Is(TVar7);
                if (!bVar4) goto LAB_004a30cc;
                pJVar11 = JITTypeHolderBase<void>::operator->(&local_40);
                pJVar12 = JITType::GetTypeHandler(pJVar11);
                bVar4 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar12);
                if ((!bVar4) ||
                   (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                      ((this->currentBlock->globOptData).liveFields,type.t._4_4_),
                   BVar5 == '\0')) goto LAB_004a30cc;
                cVar16 = '\x01';
              }
              else {
                this_00 = pJVar10->jsTypeSet;
                if (this_00 != (EquivalentTypeSet *)0x0) {
                  if (this_00->count != 0) {
                    index = 0;
                    do {
                      local_40.t = (Type)Js::EquivalentTypeSet::GetType(this_00,index);
                      local_48 = (nullptr_t)0x0;
                      bVar4 = JITTypeHolderBase<void>::operator!=(&local_40,&local_48);
                      if (bVar4) {
                        pJVar11 = JITTypeHolderBase<void>::operator->(&local_40);
                        TVar7 = JITType::GetTypeId(pJVar11);
                        bVar6 = Js::DynamicType::Is(TVar7);
                        bVar4 = true;
                        cVar16 = '\0';
                        if (bVar6) {
                          pJVar11 = JITTypeHolderBase<void>::operator->(&local_40);
                          pJVar12 = JITType::GetTypeHandler(pJVar11);
                          bVar6 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar12);
                          cVar16 = '\0';
                          if (bVar6) {
                            BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                              ((this->currentBlock->globOptData).liveFields,
                                               type.t._4_4_);
                            cVar16 = (BVar5 == '\0') * '\t' + '\x01';
                            bVar4 = false;
                          }
                        }
                      }
                      else {
                        cVar16 = '\0';
                        bVar4 = true;
                      }
                      if (!bVar4) goto LAB_004a30ba;
                      index = index + 1;
                    } while (index < this_00->count);
                  }
                  cVar16 = '\n';
LAB_004a30ba:
                  if (cVar16 != '\n') goto LAB_004a30cf;
                }
LAB_004a30cc:
                cVar16 = '\0';
              }
LAB_004a30cf:
              if (cVar16 == '\0') goto LAB_004a30d4;
            }
            if (cVar16 != '\0') break;
          }
          uVar15 = uVar15 & ~(1L << (uVar14 & 0x3f));
          lVar2 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          cVar16 = '\0';
          uVar14 = (ulong)(-(uint)(uVar15 == 0) | (uint)lVar2);
        } while (uVar15 != 0);
      }
    } while (cVar16 == '\0');
    bVar4 = cVar16 != '\x02';
  }
  return bVar4;
}

Assistant:

bool
GlobOpt::HasLiveObjectHeaderInlinedTypeSym(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    return this->MapObjectHeaderInlinedTypeSymsUntil(block, true, opndId, [&](SymID symId)->bool { return this->currentBlock->globOptData.liveFields->Test(symId); });
}